

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O1

void __thiscall
htmlcxx2::HTML::Node::Node
          (Node *this,string *tagName,string *text,string *closingText,size_t offset,size_t length,
          Kind kind)

{
  size_type sVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  size_type sVar3;
  
  (this->tagName_)._M_dataplus._M_p = (pointer)&(this->tagName_).field_2;
  (this->tagName_)._M_string_length = 0;
  (this->tagName_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)this);
  sVar1 = tagName->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (tagName->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      tolower((int)pcVar2[sVar3]);
      std::__cxx11::string::push_back((char)this);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  (this->text_)._M_dataplus._M_p = (pointer)&(this->text_).field_2;
  pcVar2 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text_,pcVar2,pcVar2 + text->_M_string_length);
  (this->closingText_)._M_dataplus._M_p = (pointer)&(this->closingText_).field_2;
  (this->closingText_)._M_string_length = 0;
  (this->closingText_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&this->closingText_);
  sVar1 = closingText->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (closingText->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      tolower((int)pcVar2[sVar3]);
      std::__cxx11::string::push_back((char)&this->closingText_);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  this->offset_ = offset;
  this->length_ = length;
  this->kind_ = kind;
  (this->attributeKeys_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributeKeys_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributeKeys_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributeValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributeValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributeValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->attributesParsed_ = false;
  return;
}

Assistant:

Node(const std::string &tagName,
            const std::string &text,
            const std::string &closingText,
            size_t offset,
            size_t length,
            Kind kind) :
        tagName_(impl::toLower(tagName)),
        text_(text),
        closingText_(impl::toLower(closingText)),
        offset_(offset),
        length_(length),
        kind_(kind),
        attributeKeys_(),
        attributeValues_(),
        attributesParsed_(false) { }